

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  void *pvVar1;
  char *pcVar2;
  FileSystem *pFVar3;
  ulong uVar4;
  uint uVar5;
  SourceMgr *this_00;
  SMRange *pSVar6;
  size_type sVar7;
  SMLoc Loc;
  ArrayRef<llvm::SMRange> Ranges;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_b0;
  SMRange local_a8;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_90;
  StringRef filename_local;
  string local_50;
  
  filename_local.Length = filename.Length;
  filename_local.Data = filename.Data;
  pvVar1 = this->impl;
  LOCK();
  *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + 1;
  UNLOCK();
  local_a8.Start.Ptr = (char *)0x0;
  local_a8.End.Ptr = (char *)0x0;
  if ((filename_local.Length != 0) && (at->start != (char *)0x0)) {
    pFVar3 = BuildSystem::getFileSystem(*(BuildSystem **)(*(long *)((long)pvVar1 + 0x30) + 0x20));
    llvm::StringRef::str_abi_cxx11_(&local_50,&filename_local);
    (*pFVar3->_vptr_FileSystem[4])(&local_b0,pFVar3,&local_50);
    std::__cxx11::string::_M_dispose();
    if (local_b0._M_head_impl != (MemoryBuffer *)0x0) {
      uVar5 = (int)at->start - (int)*(undefined8 *)((long)pvVar1 + 8);
      uVar4 = (ulong)(at->length + uVar5);
      pcVar2 = (local_b0._M_head_impl)->BufferStart;
      if (uVar4 < (ulong)((long)(local_b0._M_head_impl)->BufferEnd - (long)pcVar2)) {
        Loc.Ptr = pcVar2 + uVar5;
        local_a8.End.Ptr = pcVar2 + uVar4;
        local_90._M_head_impl = local_b0._M_head_impl;
        local_b0._M_head_impl = (MemoryBuffer *)0x0;
        local_a8.Start.Ptr = Loc.Ptr;
        llvm::SourceMgr::AddNewSourceBuffer
                  (*this->impl,
                   (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                   &local_90,(SMLoc)0x0);
        if (local_90._M_head_impl != (MemoryBuffer *)0x0) {
          (*(local_90._M_head_impl)->_vptr_MemoryBuffer[1])();
        }
        local_90._M_head_impl = (MemoryBuffer *)0x0;
        if (local_b0._M_head_impl != (MemoryBuffer *)0x0) goto LAB_00114ab9;
      }
      else {
        Loc.Ptr = (char *)0x0;
LAB_00114ab9:
        (*(local_b0._M_head_impl)->_vptr_MemoryBuffer[1])();
      }
      if (Loc.Ptr != (char *)0x0) {
        this_00 = *this->impl;
        pSVar6 = &local_a8;
        sVar7 = 1;
        goto LAB_00114b1c;
      }
    }
  }
  this_00 = *this->impl;
  Loc.Ptr = (char *)0x0;
  pSVar6 = (SMRange *)0x0;
  sVar7 = 0;
LAB_00114b1c:
  Ranges.Length = sVar7;
  Ranges.Data = pSVar6;
  llvm::SourceMgr::PrintMessage
            (this_00,Loc,DK_Error,message,Ranges,(ArrayRef<llvm::SMFixIt>)ZEXT816(0),true);
  fflush(_stderr);
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(StringRef filename,
                                   const Token& at,
                                   const Twine& message) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  
  ++impl->numErrors;

  // If we have a file and token, resolve the location and range to one
  // accessible by the source manager.
  //
  // FIXME: We shouldn't need to do this, but should switch llbuild to using
  // SourceMgr natively.
  llvm::SMLoc loc{};
  llvm::SMRange range{};
  if (!filename.empty() && at.start) {
    // FIXME: We ignore errors here, for now, this will be resolved when we move
    // to SourceMgr completely.
    auto buffer = impl->frontend->system->getFileSystem().getFileContents(filename);
    if (buffer) {
      unsigned offset = at.start - impl->bufferBeingParsed.data();
      if (offset + at.length < buffer->getBufferSize()) {
        range.Start = loc = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + offset);
        range.End = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + (offset + at.length));
        getSourceMgr().AddNewSourceBuffer(std::move(buffer), llvm::SMLoc{});
      }
    }
  }

  if (range.Start.isValid()) {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message, range);
  } else {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message);
  }
  fflush(stderr);
}